

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d603ce::SegmentTree::produceIntersectionsLeaf
          (SegmentTree *this,TreeNode *node,int segment)

{
  QRectF *this_00;
  const_reference piVar1;
  QRectF *this_01;
  qsizetype qVar2;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QPathSegments *this_02;
  qreal qVar3;
  qreal qVar4;
  QLineF *unaff_retaddr;
  SegmentTree *in_stack_00000008;
  int k;
  QRectF *r2;
  int other;
  int i;
  QRectF *r1;
  Intersection j_isect;
  Intersection i_isect;
  QLineF lineB;
  QLineF lineA;
  QPointF *in_stack_ffffffffffffff28;
  QPathSegments *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff48;
  QPathSegments *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  int iVar5;
  int local_8c;
  QDataBuffer<QIntersection> *intersections;
  QLineF *b;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  b = *(QLineF **)(in_FS_OFFSET + 0x28);
  this_00 = QPathSegments::elementBounds
                      (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  intersections = (QDataBuffer<QIntersection> *)0xffffffffffffffff;
  QPathSegments::lineAt(in_stack_ffffffffffffff50,iVar5);
  for (local_8c = *(int *)(in_RSI + 0x1c); local_8c < *(int *)(in_RSI + 0x20);
      local_8c = local_8c + 1) {
    piVar1 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,
                            (qsizetype)in_stack_ffffffffffffff28);
    if (*piVar1 < in_EDX) {
      this_01 = QPathSegments::elementBounds
                          (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20)
                          );
      this_02 = (QPathSegments *)QRectF::left(this_00);
      qVar3 = QRectF::right(this_01);
      if ((double)this_02 <= qVar3) {
        qVar3 = QRectF::left(this_01);
        qVar4 = QRectF::right(this_00);
        if (qVar3 <= qVar4) {
          qVar4 = QRectF::top(this_00);
          iVar5 = (int)((ulong)qVar3 >> 0x20);
          qVar3 = QRectF::bottom(this_01);
          if (qVar4 <= qVar3) {
            qVar3 = QRectF::top(this_01);
            qVar4 = QRectF::bottom(this_00);
            if (qVar3 <= qVar4) {
              QDataBuffer<QIntersection>::reset((QDataBuffer<QIntersection> *)(in_RDI + 0xb));
              QPathSegments::lineAt(this_02,iVar5);
              intersectLines(in_stack_00000008,unaff_retaddr,b,intersections);
              iVar5 = 0;
              while( true ) {
                in_stack_ffffffffffffff30 = (QPathSegments *)(long)iVar5;
                qVar2 = QDataBuffer<QIntersection>::size
                                  ((QDataBuffer<QIntersection> *)(in_RDI + 0xb));
                if (qVar2 <= (long)in_stack_ffffffffffffff30) break;
                QDataBuffer<QIntersection>::at
                          ((QDataBuffer<QIntersection> *)(in_RDI + 0xb),(long)iVar5);
                QDataBuffer<QIntersection>::at
                          ((QDataBuffer<QIntersection> *)(in_RDI + 0xb),(long)iVar5);
                in_stack_ffffffffffffff28 = (QPointF *)*in_RDI;
                QDataBuffer<QIntersection>::at
                          ((QDataBuffer<QIntersection> *)(in_RDI + 0xb),(long)iVar5);
                QPathSegments::addPoint(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                QPathSegments::addIntersection
                          ((QPathSegments *)CONCAT44(iVar5,in_stack_ffffffffffffff60),
                           (int)((ulong)in_RDI >> 0x20),(Intersection *)this_02);
                QPathSegments::addIntersection
                          ((QPathSegments *)CONCAT44(iVar5,in_stack_ffffffffffffff60),
                           (int)((ulong)in_RDI >> 0x20),(Intersection *)this_02);
                iVar5 = iVar5 + 1;
              }
            }
          }
        }
      }
    }
  }
  if (*(QLineF **)(in_FS_OFFSET + 0x28) != b) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SegmentTree::produceIntersectionsLeaf(const TreeNode &node, int segment)
{
    const QRectF &r1 = m_segments.elementBounds(segment);
    const QLineF lineA = m_segments.lineAt(segment);

    for (int i = node.index.interval.first; i < node.index.interval.last; ++i) {
        const int other = m_index.at(i);
        if (other >= segment)
            continue;

        const QRectF &r2 = m_segments.elementBounds(other);

        if (r1.left() > r2.right() || r2.left() > r1.right())
            continue;
        if (r1.top() > r2.bottom() || r2.top() > r1.bottom())
            continue;

        m_intersections.reset();

        const QLineF lineB = m_segments.lineAt(other);

        intersectLines(lineA, lineB, m_intersections);

        for (int k = 0; k < m_intersections.size(); ++k) {
            QPathSegments::Intersection i_isect, j_isect;
            i_isect.t = m_intersections.at(k).alphaA;
            j_isect.t = m_intersections.at(k).alphaB;

            i_isect.vertex = j_isect.vertex = m_segments.addPoint(m_intersections.at(k).pos);

            i_isect.next = 0;
            j_isect.next = 0;

            m_segments.addIntersection(segment, i_isect);
            m_segments.addIntersection(other, j_isect);
        }
    }
}